

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O0

token * dmrC_tokenize_buffer(dmr_C *C,uchar *buffer,unsigned_long size,token **endtoken)

{
  token *ptVar1;
  token *ptVar2;
  token *begin;
  stream_t stream;
  token **endtoken_local;
  unsigned_long size_local;
  uchar *buffer_local;
  dmr_C *C_local;
  
  stream.buffer = (uchar *)endtoken;
  ptVar1 = setup_stream(C,(stream_t *)&begin,0,-1,buffer,(uint)size);
  ptVar2 = tokenize_stream(C,(stream_t *)&begin);
  *(token **)stream.buffer = ptVar2;
  return ptVar1;
}

Assistant:

struct token *dmrC_tokenize_buffer(struct dmr_C *C, unsigned char *buffer,
			      unsigned long size, struct token **endtoken)
{
	stream_t stream;
	struct token *begin;

	begin = setup_stream(C, &stream, 0, -1, buffer, size);
	*endtoken = tokenize_stream(C, &stream);
	return begin;
}